

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O2

ion_err_t ion_close_all_master_table(void)

{
  ion_err_t iVar1;
  int iVar2;
  ion_dictionary_id_t iVar3;
  ion_dictionary_id_t id;
  ion_dictionary_config_info_t config;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  ion_dictionary_config_info_t iStack_a8;
  ion_dictionary_t local_88;
  ion_dictionary_handler_t local_70;
  
  if (ion_master_table_file != (FILE *)0x0) {
    id = ion_master_table_next_id - 1;
    while (iVar3 = id - 1, id != 0) {
      iVar1 = ion_lookup_in_master_table(id,&iStack_a8);
      id = iVar3;
      if ((iVar1 == '\0') && (iStack_a8.dictionary_status != '\x01')) {
        iVar1 = ion_switch_handler(iStack_a8.dictionary_type,&local_70);
        if (iVar1 != '\0') {
          return iVar1;
        }
        local_88.handler = &local_70;
        iVar1 = dictionary_open(&local_70,&local_88,&iStack_a8);
        if (iVar1 != '\0') {
          return iVar1;
        }
        iVar1 = dictionary_close(&local_88);
        if (iVar1 != '\0') {
          return iVar1;
        }
      }
    }
    iVar2 = fclose((FILE *)ion_master_table_file);
    if (iVar2 != 0) {
      return '\n';
    }
  }
  ion_master_table_file = (FILE *)0x0;
  return '\0';
}

Assistant:

ion_err_t
ion_close_all_master_table(
	void
) {
	ion_err_t						err;
	ion_dictionary_handler_t		handler;
	ion_dictionary_t				dict;
	ion_dictionary_config_info_t	config;

	ion_dictionary_id_t id = ion_master_table_next_id;

	if (NULL != ion_master_table_file) {
		id--;

		while (id > 0) {
			err = ion_lookup_in_master_table(id, &config);

			/* Dictionary corresponding to ID has been found and dictionary is open. */
			if ((err_ok == err) && (ion_dictionary_status_closed != config.dictionary_status)) {
				err = ion_switch_handler(config.dictionary_type, &handler);

				if (err_ok != err) {
					return err;
				}

				dict.handler	= &handler;

				/* Initialize dictionary instance. */
				err				= dictionary_open(&handler, &dict, &config);

				if (err_ok != err) {
					return err;
				}

				/* Close the dictionary instance. */
				err = dictionary_close(&dict);

				if (err_ok != err) {
					return err;
				}
			}

			id--;
		}

		if (0 != fclose(ion_master_table_file)) {
			return err_file_close_error;
		}
	}

	ion_master_table_file = NULL;

	return err_ok;
}